

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerator::Logger::Error(Logger *this,GenT genType,string *message)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_80;
  string local_60;
  string local_40;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar3 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  HeadLine(&local_40,&local_60);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)(message->_M_dataplus)._M_p);
  if (local_80._M_dataplus._M_p[local_80._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&local_80);
  }
  std::__cxx11::string::push_back((char)&local_80);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    cmSystemTools::Stderr(&local_80);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void cmQtAutoGenerator::Logger::Error(GenT genType,
                                      std::string const& message) const
{
  std::string msg;
  msg += HeadLine(GeneratorName(genType) + " error");
  // Message
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  msg.push_back('\n');
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stderr(msg);
  }
}